

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

long __thiscall tetgenmesh::lawsonflip3d(tetgenmesh *this,flipconstraints *fc)

{
  badface **fstack;
  memorypool *pmVar1;
  tetrahedron ppdVar2;
  tetrahedron pd;
  double *pdVar3;
  long lVar4;
  badface *pbVar5;
  ulong uVar6;
  char *pcVar7;
  int *piVar8;
  arraypool *paVar9;
  uint uVar10;
  ulong uVar11;
  tetrahedron *pppdVar12;
  ulong uVar13;
  triface *flipface;
  long lVar14;
  long lVar15;
  tetgenmesh *this_00;
  uint uVar16;
  int iVar17;
  int iVar18;
  double dVar19;
  double dVar20;
  ulong local_b0;
  triface local_a8;
  triface local_98;
  tetrahedron *local_88;
  uint local_80;
  tetrahedron *local_78;
  uint local_70;
  tetrahedron *local_68;
  int local_60;
  long local_58;
  long local_50;
  flipconstraints *local_48;
  double local_40;
  double local_38;
  
  lVar4 = 8;
  do {
    *(undefined8 *)((long)&local_b0 + lVar4) = 0;
    *(undefined4 *)((long)&local_a8.tet + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x58);
  fstack = &this->flipstack;
  iVar18 = 0;
  local_50 = 0;
  local_58 = 0;
  local_48 = fc;
  while( true ) {
    if (2 < this->b->verbose) {
      printf("      Lawson flip %ld faces.\n");
    }
    pbVar5 = *fstack;
    if (pbVar5 == (badface *)0x0) break;
    uVar6 = 0;
    do {
      local_a8.tet = (pbVar5->tt).tet;
      local_a8.ver = (pbVar5->tt).ver;
      this->flipstack = pbVar5->nextitem;
      pmVar1 = this->flippool;
      (pbVar5->tt).tet = (tetrahedron *)pmVar1->deaditemstack;
      pmVar1->deaditemstack = pbVar5;
      pmVar1->items = pmVar1->items + -1;
      if ((local_a8.tet != (tetrahedron *)0x0) && (local_a8.tet[4] != (tetrahedron)0x0)) {
        uVar10 = *(uint *)((long)local_a8.tet + (long)this->elemmarkerindex * 4);
        uVar16 = 4 << ((byte)local_a8.ver & 3);
        if ((uVar10 & uVar16) != 0) {
          *(uint *)((long)local_a8.tet + (long)this->elemmarkerindex * 4) = uVar10 & ~uVar16;
          ppdVar2 = (tetrahedron)this->dummypoint;
          if (local_a8.tet[7] != ppdVar2) {
            uVar10 = local_a8.ver & 3;
            local_98.tet = (tetrahedron *)((ulong)local_a8.tet[uVar10] & 0xfffffffffffffff0);
            local_98.ver = fsymtbl[local_a8.ver][(uint)local_a8.tet[uVar10] & 0xf];
            local_b0 = uVar6;
            if (local_98.tet[7] == ppdVar2) {
              if (this->nonconvex != 0) {
                if (local_a8.tet[9] == (tetrahedron)0x0) {
                  uVar13 = 0;
                }
                else {
                  pdVar3 = local_a8.tet[9][uVar10];
                  uVar13 = (ulong)pdVar3 & 0xfffffffffffffff8;
                  iVar18 = tspivottbl[local_a8.ver][(uint)pdVar3 & 7];
                }
                iVar17 = 3;
                do {
                  if (*(long *)(uVar13 + 0x30 + (long)(iVar18 >> 1) * 8) == 0) {
                    uVar11 = *(ulong *)(uVar13 + (long)(iVar18 >> 1) * 8);
                    uVar16 = (uint)uVar11 & 7;
                    uVar11 = uVar11 & 0xfffffffffffffff8;
                    uVar16 = *(long *)(uVar13 + (long)sorgpivot[iVar18] * 8) !=
                             *(long *)(uVar11 + (long)sdestpivot[uVar16] * 8) ^ uVar16;
                    uVar11 = *(ulong *)(uVar11 + 0x48 + (ulong)(uVar16 & 1) * 8);
                    uVar10 = (uint)uVar11 & 0xf;
                    pppdVar12 = (tetrahedron *)(uVar11 & 0xfffffffffffffff0);
                    if (pppdVar12 != (tetrahedron *)0x0) {
                      uVar10 = stpivottbl[uVar10][uVar16];
                    }
                    if (local_a8.tet == pppdVar12) {
                      if (*(tetrahedron *)
                           (((ulong)pppdVar12[edestoppotbl[(int)uVar10] & 3] & 0xfffffffffffffff0) +
                           (long)oppopivot[fsymtbl[edestoppotbl[(int)uVar10]]
                                           [(uint)pppdVar12[edestoppotbl[(int)uVar10] & 3] & 0xf]] *
                           8) == ppdVar2) {
                        piVar8 = orgpivot;
                      }
                      else {
                        if (*(tetrahedron *)
                             (((ulong)pppdVar12[eorgoppotbl[(int)uVar10] & 3] & 0xfffffffffffffff0)
                             + (long)oppopivot[fsymtbl[eorgoppotbl[(int)uVar10]]
                                               [(uint)pppdVar12[eorgoppotbl[(int)uVar10] & 3] & 0xf]
                                              ] * 8) != ppdVar2) {
                          local_98.tet = (tetrahedron *)
                                         ((ulong)pppdVar12[facepivot1[(int)uVar10]] &
                                         0xfffffffffffffff0);
                          local_98.ver = facepivot2[(int)uVar10]
                                         [(uint)pppdVar12[facepivot1[(int)uVar10]] & 0xf];
                          local_88 = (tetrahedron *)
                                     ((ulong)local_98.tet[facepivot1[local_98.ver]] &
                                     0xfffffffffffffff0);
                          local_80 = facepivot2[local_98.ver]
                                     [(uint)local_98.tet[facepivot1[local_98.ver]] & 0xf];
                          local_a8.tet = pppdVar12;
                          local_a8.ver = uVar10;
                          flip32(this,&local_a8,1,fc);
                          this->flip32count = this->flip32count + -1;
                          this->flip22count = this->flip22count + -1;
                          local_58 = local_58 + 1;
                          uVar6 = local_b0;
                          if (fc->remove_ndelaunay_edge != 0) {
                            this->tetprism_vol_sum = fc->tetprism_vol_sum + this->tetprism_vol_sum;
                            fc->tetprism_vol_sum = 0.0;
                          }
                          break;
                        }
                        piVar8 = destpivot;
                      }
                      if ((*(uint *)((long)pppdVar12[piVar8[(int)uVar10]] +
                                    (long)this->pointmarkindex * 4 + 4) & 0xfffffe00) == 0x600) {
                        removevertexbyflips(this,(point)pppdVar12[piVar8[(int)uVar10]]);
                        uVar6 = local_b0;
                      }
                      break;
                    }
                  }
                  iVar18 = snextpivot[iVar18];
                  iVar17 = iVar17 + -1;
                } while (iVar17 != 0);
              }
            }
            else if ((((this->checksubfaceflag == 0) || (local_a8.tet[9] == (tetrahedron)0x0)) ||
                     (local_a8.tet[9][uVar10] == (double *)0x0)) &&
                    (dVar19 = insphere_s(this,(double *)local_98.tet[4],(double *)local_98.tet[5],
                                         (double *)local_98.tet[6],(double *)local_98.tet[7],
                                         (double *)local_a8.tet[oppopivot[local_a8.ver]]),
                    uVar6 = local_b0, dVar19 < 0.0)) {
              uVar6 = (ulong)local_a8.ver;
              ppdVar2 = local_a8.tet[oppopivot[uVar6]];
              pd = local_98.tet[oppopivot[local_98.ver]];
              local_40 = SQRT(((double)pd[2] - (double)ppdVar2[2]) *
                              ((double)pd[2] - (double)ppdVar2[2]) +
                              ((double)*pd - (double)*ppdVar2) * ((double)*pd - (double)*ppdVar2) +
                              ((double)pd[1] - (double)ppdVar2[1]) *
                              ((double)pd[1] - (double)ppdVar2[1]));
              local_40 = local_40 * local_40 * local_40;
              iVar17 = 3;
              do {
                dVar19 = orient3d((double *)local_a8.tet[orgpivot[(int)uVar6]],
                                  (double *)local_a8.tet[destpivot[(int)uVar6]],(double *)ppdVar2,
                                  (double *)pd);
                if (0.0 < dVar19) {
                  local_88 = local_a8.tet;
                  lVar4 = (long)local_a8.ver;
                  local_80 = esymtbl[lVar4];
                  this_00 = (tetgenmesh *)(ulong)local_80;
                  local_78 = local_98.tet;
                  local_70 = esymtbl[local_98.ver];
                  if ((((local_a8.tet[9] != (tetrahedron)0x0) &&
                       (this_00 = (tetgenmesh *)(ulong)(local_80 & 3),
                       local_a8.tet[9][(long)this_00] != (double *)0x0)) ||
                      ((local_98.tet[9] != (tetrahedron)0x0 &&
                       (local_98.tet[9][local_70 & 3] != (double *)0x0)))) &&
                     (local_38 = dVar19,
                     dVar20 = orient3dfast(this_00,(double *)local_a8.tet[orgpivot[lVar4]],
                                           (double *)local_a8.tet[destpivot[lVar4]],
                                           (double *)ppdVar2,(double *)pd), dVar19 = local_38,
                     ABS(dVar20) / local_40 < this->b->epsilon)) {
                    dVar19 = 0.0;
                    goto LAB_00145264;
                  }
                }
                fc = local_48;
                if (dVar19 <= 0.0) break;
                local_a8.ver = enexttbl[local_a8.ver];
                uVar6 = (ulong)(uint)local_a8.ver;
                local_98.ver = eprevtbl[local_98.ver];
                iVar17 = iVar17 + -1;
              } while (iVar17 != 0);
              if (dVar19 <= 0.0) {
LAB_00145264:
                fc = local_48;
                if (((this->checksubsegflag != 0) && (local_a8.tet[8] != (tetrahedron)0x0)) &&
                   (uVar6 = local_b0, local_a8.tet[8][ver2edge[local_a8.ver]] != (double *)0x0))
                goto LAB_00145479;
                local_a8.ver = esymtbl[local_a8.ver];
                lVar4 = 0x18;
                pppdVar12 = local_a8.tet;
                uVar10 = local_a8.ver;
                do {
                  ppdVar2 = pppdVar12[facepivot1[(int)uVar10]];
                  pppdVar12 = (tetrahedron *)((ulong)ppdVar2 & 0xfffffffffffffff0);
                  *(tetrahedron **)((long)&local_b0 + lVar4) = pppdVar12;
                  uVar10 = facepivot2[(int)uVar10][(uint)ppdVar2 & 0xf];
                  *(uint *)((long)&local_a8.tet + lVar4) = uVar10;
                  lVar4 = lVar4 + 0x10;
                } while (lVar4 != 0x48);
                if (local_78 == local_a8.tet) {
                  flip32(this,&local_a8,0,local_48);
                }
                else {
                  lVar4 = (long)(int)local_70;
                  local_68 = (tetrahedron *)
                             ((ulong)local_78[facepivot1[lVar4]] & 0xfffffffffffffff0);
                  local_60 = facepivot2[lVar4][(uint)local_78[facepivot1[lVar4]] & 0xf];
                  if ((local_a8.tet != local_68) ||
                     (((this->nonconvex == 0 ||
                       (local_78[apexpivot[lVar4]] != (tetrahedron)this->dummypoint)) &&
                      ((dVar19 != 0.0 || (NAN(dVar19))))))) {
                    paVar9 = this->unflipqueue;
                    pcVar7 = arraypool::getblock(paVar9,(int)paVar9->objects);
                    lVar14 = (long)paVar9->objectbytes *
                             ((long)paVar9->objectsperblock - 1U & paVar9->objects);
                    paVar9->objects = paVar9->objects + 1;
                    *(tetrahedron **)(pcVar7 + lVar14) = local_a8.tet;
                    lVar4 = (long)local_a8.ver;
                    *(int *)(pcVar7 + lVar14 + 8) = local_a8.ver;
                    *(tetrahedron *)(pcVar7 + lVar14 + 0x58) = local_a8.tet[orgpivot[lVar4]];
                    *(tetrahedron *)(pcVar7 + lVar14 + 0x60) = local_a8.tet[destpivot[lVar4]];
                    *(tetrahedron *)(pcVar7 + lVar14 + 0x68) = local_a8.tet[apexpivot[lVar4]];
                    uVar6 = local_b0;
                    goto LAB_00145479;
                  }
                  local_a8.ver = esymtbl[local_a8.ver];
                  flip23(this,&local_a8,0,local_48);
                  lVar4 = (long)(int)local_70;
                  local_98.tet = (tetrahedron *)
                                 ((ulong)local_78[facepivot1[lVar4]] & 0xfffffffffffffff0);
                  local_98.ver = facepivot2[lVar4][(uint)local_78[facepivot1[lVar4]] & 0xf];
                  local_88 = (tetrahedron *)
                             ((ulong)local_98.tet[facepivot1[local_98.ver]] & 0xfffffffffffffff0);
                  local_80 = facepivot2[local_98.ver]
                             [(uint)local_98.tet[facepivot1[local_98.ver]] & 0xf];
                  flip32(this,&local_98,
                         (uint)(local_78[apexpivot[lVar4]] == (tetrahedron)this->dummypoint),fc);
                  this->flip23count = this->flip23count + -1;
                  this->flip32count = this->flip32count + -1;
                  this->flip44count = this->flip44count + 1;
                }
                iVar17 = fc->remove_ndelaunay_edge;
              }
              else {
                flip23(this,&local_a8,0,local_48);
                iVar17 = fc->remove_ndelaunay_edge;
              }
              uVar6 = local_b0 + 1;
              if (iVar17 != 0) {
                this->tetprism_vol_sum = fc->tetprism_vol_sum + this->tetprism_vol_sum;
                fc->tetprism_vol_sum = 0.0;
              }
            }
          }
        }
      }
LAB_00145479:
      pbVar5 = *fstack;
    } while (pbVar5 != (badface *)0x0);
    if (0 < (long)uVar6 && 2 < this->b->verbose) {
      printf("      Performed %ld flips.\n");
    }
    local_50 = local_50 + uVar6;
    paVar9 = this->unflipqueue;
    if ((paVar9->objects == 0) || (uVar6 == 0)) break;
    if (0 < paVar9->objects) {
      lVar4 = 0;
      do {
        lVar15 = (long)paVar9->objectbytes * (long)(int)(paVar9->objectsperblockmark & (uint)lVar4);
        lVar14 = *(long *)(paVar9->toparray
                           [(uint)lVar4 >> ((byte)paVar9->log2objectsperblock & 0x1f)] + lVar15);
        if ((lVar14 != 0) && (*(long *)(lVar14 + 0x20) != 0)) {
          flipface = (triface *)
                     (paVar9->toparray[(uint)lVar4 >> ((byte)paVar9->log2objectsperblock & 0x1f)] +
                     lVar15);
          iVar17 = flipface->ver;
          if ((*(long *)(lVar14 + (long)orgpivot[iVar17] * 8) == *(long *)&flipface[5].ver) &&
             ((*(tetrahedron **)(lVar14 + (long)destpivot[iVar17] * 8) == flipface[6].tet &&
              (*(long *)(lVar14 + (long)apexpivot[iVar17] * 8) == *(long *)&flipface[6].ver)))) {
            flippush(this,fstack,flipface);
            paVar9 = this->unflipqueue;
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < paVar9->objects);
    }
    paVar9->objects = 0;
  }
  lVar14 = local_50;
  lVar4 = local_58;
  if (2 < this->b->verbose) {
    if (0 < local_50) {
      printf("      Performed %ld flips.\n",local_50);
    }
    if (0 < lVar4) {
      printf("      Removed %ld hull slivers.\n",lVar4);
    }
    if (0 < this->unflipqueue->objects) {
      printf("      %ld unflippable edges remained.\n");
    }
  }
  return lVar14 + lVar4;
}

Assistant:

long tetgenmesh::lawsonflip3d(flipconstraints *fc)
{
  triface fliptets[5], neightet, hulltet;
  face checksh, casingout;
  badface *popface, *bface;
  point pd, pe, *pts;
  REAL sign, ori;
  REAL vol, len3;
  long flipcount, totalcount = 0l;
  long sliver_peels = 0l;
  int t1ver;
  int i;


  while (1) {

    if (b->verbose > 2) {
      printf("      Lawson flip %ld faces.\n", flippool->items);
    }
    flipcount = 0l;

    while (flipstack != (badface *) NULL) {
      // Pop a face from the stack.
      popface = flipstack;
      fliptets[0] = popface->tt;
      flipstack = flipstack->nextitem; // The next top item in stack.
      flippool->dealloc((void *) popface);

      // Skip it if it is a dead tet (destroyed by previous flips).
      if (isdeadtet(fliptets[0])) continue;
      // Skip it if it is not the same tet as we saved.
      if (!facemarked(fliptets[0])) continue;

      unmarkface(fliptets[0]);

      if (ishulltet(fliptets[0])) continue;

      fsym(fliptets[0], fliptets[1]);
      if (ishulltet(fliptets[1])) {
        if (nonconvex) {
          // Check if 'fliptets[0]' it is a hull sliver.
          tspivot(fliptets[0], checksh);
          for (i = 0; i < 3; i++) {
            if (!isshsubseg(checksh)) {
              spivot(checksh, casingout);
              //assert(casingout.sh != NULL);
              if (sorg(checksh) != sdest(casingout)) sesymself(casingout);
              stpivot(casingout, neightet);
              if (neightet.tet == fliptets[0].tet) {
                // Found a hull sliver 'neightet'. Let it be [e,d,a,b], where 
                //   [e,d,a] and [d,e,b] are hull faces.
                edestoppo(neightet, hulltet); // [a,b,e,d]
                fsymself(hulltet); // [b,a,e,#]
                if (oppo(hulltet) == dummypoint) {
                  pe = org(neightet);
                  if ((pointtype(pe) == FREEFACETVERTEX) ||
                      (pointtype(pe) == FREESEGVERTEX)) {
                    removevertexbyflips(pe);
                  }
                } else {
                  eorgoppo(neightet, hulltet); // [b,a,d,e]
                  fsymself(hulltet); // [a,b,d,#]
                  if (oppo(hulltet) == dummypoint) {
                    pd = dest(neightet);
                    if ((pointtype(pd) == FREEFACETVERTEX) ||
                        (pointtype(pd) == FREESEGVERTEX)) {
                      removevertexbyflips(pd);
                    }
                  } else {
                    // Perform a 3-to-2 flip to remove the sliver.
                    fliptets[0] = neightet;          // [e,d,a,b]
                    fnext(fliptets[0], fliptets[1]); // [e,d,b,c]
                    fnext(fliptets[1], fliptets[2]); // [e,d,c,a]
                    flip32(fliptets, 1, fc);
                    // Update counters.
                    flip32count--;
                    flip22count--;
                    sliver_peels++;
                    if (fc->remove_ndelaunay_edge) {
                      // Update the volume (must be decreased).
                      //assert(fc->tetprism_vol_sum <= 0);
                      tetprism_vol_sum += fc->tetprism_vol_sum;
                      fc->tetprism_vol_sum = 0.0; // Clear it.
                    }
                  }
                }
                break;
              } // if (neightet.tet == fliptets[0].tet)
            } // if (!isshsubseg(checksh))
            senextself(checksh);
          } // i
        } // if (nonconvex)
        continue;
      }

      if (checksubfaceflag) {
        // Do not flip if it is a subface.
        if (issubface(fliptets[0])) continue;
      }

      // Test whether the face is locally Delaunay or not.
      pts = (point *) fliptets[1].tet; 
      sign = insphere_s(pts[4], pts[5], pts[6], pts[7], oppo(fliptets[0]));

      if (sign < 0) {
        // A non-Delaunay face. Try to flip it.
        pd = oppo(fliptets[0]);
        pe = oppo(fliptets[1]);

        // Use the length of the edge [d,e] as a reference to determine
        //   a nearly degenerated new tet.
        len3 = distance(pd, pe);
        len3 = (len3 * len3 * len3);

        // Check the convexity of its three edges. Stop checking either a
        //   locally non-convex edge (ori < 0) or a flat edge (ori = 0) is
        //   encountered, and 'fliptet' represents that edge.
        for (i = 0; i < 3; i++) {
          ori = orient3d(org(fliptets[0]), dest(fliptets[0]), pd, pe);
          if (ori > 0) {
            // Avoid creating a nearly degenerated new tet at boundary.
            //   Re-use fliptets[2], fliptets[3];
            esym(fliptets[0], fliptets[2]);
            esym(fliptets[1], fliptets[3]);
            if (issubface(fliptets[2]) || issubface(fliptets[3])) {
              vol = orient3dfast(org(fliptets[0]), dest(fliptets[0]), pd, pe);
              if ((fabs(vol) / len3) < b->epsilon) {
                ori = 0.0; // Do rounding.
              }
            }
          } // Rounding check
          if (ori <= 0) break;
          enextself(fliptets[0]);
          eprevself(fliptets[1]);
        }

        if (ori > 0) {
          // A 2-to-3 flip is found.
          //   [0] [a,b,c,d], 
          //   [1] [b,a,c,e]. no dummypoint.
          flip23(fliptets, 0, fc);
          flipcount++;
          if (fc->remove_ndelaunay_edge) {
            // Update the volume (must be decreased).
            //assert(fc->tetprism_vol_sum <= 0);
            tetprism_vol_sum += fc->tetprism_vol_sum;
            fc->tetprism_vol_sum = 0.0; // Clear it.
          }
          continue;
        } else { // ori <= 0
          // The edge ('fliptets[0]' = [a',b',c',d]) is non-convex or flat,
          //   where the edge [a',b'] is one of [a,b], [b,c], and [c,a].
          if (checksubsegflag) {
            // Do not flip if it is a segment.
            if (issubseg(fliptets[0])) continue;
          }
          // Check if there are three or four tets sharing at this edge.        
          esymself(fliptets[0]); // [b,a,d,c]
          for (i = 0; i < 3; i++) {
            fnext(fliptets[i], fliptets[i+1]);
          }
          if (fliptets[3].tet == fliptets[0].tet) {
            // A 3-to-2 flip is found. (No hull tet.)
            flip32(fliptets, 0, fc); 
            flipcount++;
            if (fc->remove_ndelaunay_edge) {
              // Update the volume (must be decreased).
              //assert(fc->tetprism_vol_sum <= 0);
              tetprism_vol_sum += fc->tetprism_vol_sum;
              fc->tetprism_vol_sum = 0.0; // Clear it.
            }
            continue;
          } else {
            // There are more than 3 tets at this edge.
            fnext(fliptets[3], fliptets[4]);
            if (fliptets[4].tet == fliptets[0].tet) {
              // There are exactly 4 tets at this edge.
              if (nonconvex) {
                if (apex(fliptets[3]) == dummypoint) {
                  // This edge is locally non-convex on the hull.
                  // It can be removed by a 4-to-4 flip.                  
                  ori = 0;
                }
              } // if (nonconvex)
              if (ori == 0) {
                // A 4-to-4 flip is found. (Two hull tets may be involved.)
                // Current tets in 'fliptets':
                //   [0] [b,a,d,c] (d may be newpt)
                //   [1] [b,a,c,e]
                //   [2] [b,a,e,f] (f may be dummypoint)
                //   [3] [b,a,f,d]
                esymself(fliptets[0]); // [a,b,c,d] 
                // A 2-to-3 flip replaces face [a,b,c] by edge [e,d].
                //   This creates a degenerate tet [e,d,a,b] (tmpfliptets[0]).
                //   It will be removed by the followed 3-to-2 flip.
                flip23(fliptets, 0, fc); // No hull tet.
                fnext(fliptets[3], fliptets[1]);
                fnext(fliptets[1], fliptets[2]);
                // Current tets in 'fliptets':
                //   [0] [...]
                //   [1] [b,a,d,e] (degenerated, d may be new point).
                //   [2] [b,a,e,f] (f may be dummypoint)
                //   [3] [b,a,f,d]
                // A 3-to-2 flip replaces edge [b,a] by face [d,e,f].
                //   Hull tets may be involved (f may be dummypoint).
                flip32(&(fliptets[1]), (apex(fliptets[3]) == dummypoint), fc);
                flipcount++;
                flip23count--;
                flip32count--;
                flip44count++;
                if (fc->remove_ndelaunay_edge) {
                  // Update the volume (must be decreased).
                  //assert(fc->tetprism_vol_sum <= 0);
                  tetprism_vol_sum += fc->tetprism_vol_sum;
                  fc->tetprism_vol_sum = 0.0; // Clear it.
                }
                continue;
              } // if (ori == 0)
            }
          }
        } // if (ori <= 0)

        // This non-Delaunay face is unflippable. Save it.
        unflipqueue->newindex((void **) &bface);
        bface->tt = fliptets[0];
        bface->forg  = org(fliptets[0]);
        bface->fdest = dest(fliptets[0]);
        bface->fapex = apex(fliptets[0]);
      } // if (sign < 0)
    } // while (flipstack)

    if (b->verbose > 2) {
      if (flipcount > 0) {
        printf("      Performed %ld flips.\n", flipcount);
      }
    }
    // Accumulate the counter of flips.
    totalcount += flipcount;

    // Return if no unflippable faces left.
    if (unflipqueue->objects == 0l) break; 
    // Return if no flip has been performed.
    if (flipcount == 0l) break;

    // Try to flip the unflippable faces.
    for (i = 0; i < unflipqueue->objects; i++) {
      bface = (badface *) fastlookup(unflipqueue, i);
      if (!isdeadtet(bface->tt) && 
          (org(bface->tt) == bface->forg) &&
          (dest(bface->tt) == bface->fdest) &&
          (apex(bface->tt) == bface->fapex)) {
        flippush(flipstack, &(bface->tt));
      }
    }
    unflipqueue->restart();

  } // while (1)

  if (b->verbose > 2) {
    if (totalcount > 0) {
      printf("      Performed %ld flips.\n", totalcount);
    }
    if (sliver_peels > 0) {
      printf("      Removed %ld hull slivers.\n", sliver_peels);
    }
    if (unflipqueue->objects > 0l) {
      printf("      %ld unflippable edges remained.\n", unflipqueue->objects);
    }
  }

  return totalcount + sliver_peels;
}